

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O2

Vec_Flt_t * Abc_NtkTestCreateRequired(int nOutputs)

{
  Vec_Flt_t *p;
  int iVar1;
  bool bVar2;
  
  p = Vec_FltAlloc(nOutputs);
  iVar1 = 0;
  if (nOutputs < 1) {
    nOutputs = iVar1;
  }
  while (bVar2 = nOutputs != 0, nOutputs = nOutputs + -1, bVar2) {
    Vec_FltPush(p,(float)(iVar1 + 100));
    iVar1 = iVar1 + 1;
  }
  return p;
}

Assistant:

Vec_Flt_t * Abc_NtkTestCreateRequired( int nOutputs )
{
    Vec_Flt_t * p;
    int i;
    p = Vec_FltAlloc( nOutputs );
    for ( i = 0; i < nOutputs; i++ )
        Vec_FltPush( p, 100.0 + 1.0*i );
    return p;
}